

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSymbolOccurrence::~IfcAnnotationSymbolOccurrence
          (IfcAnnotationSymbolOccurrence *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *pvVar3;
  
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem = 0x9465c0;
  *(undefined8 *)&(this->super_IfcAnnotationOccurrence).field_0x90 = 0x946610;
  (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x9465e8;
  pcVar2 = (this->super_IfcAnnotationOccurrence).super_IfcStyledItem.Name.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.Name.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pvVar3 = *(void **)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcAnnotationOccurrence).super_IfcStyledItem.
                                     field_0x40 - (long)pvVar3);
    return;
  }
  return;
}

Assistant:

IfcAnnotationSymbolOccurrence() : Object("IfcAnnotationSymbolOccurrence") {}